

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

Vec_Wec_t * Spl_ManToWecMapping(Gia_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int local_4c;
  
  iVar8 = p->nObjs;
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  local_4c = 8;
  if (6 < iVar8 - 1U) {
    local_4c = iVar8;
  }
  pVVar3->nCap = local_4c;
  if (local_4c == 0) {
    __ptr = (Vec_Int_t *)0x0;
  }
  else {
    __ptr = (Vec_Int_t *)calloc((long)local_4c,0x10);
  }
  pVVar3->pArray = __ptr;
  pVVar3->nSize = iVar8;
  pVVar4 = p->vMapping;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x49,"Vec_Wec_t *Spl_ManToWecMapping(Gia_Man_t *)");
  }
  if (1 < iVar8) {
    lVar7 = 1;
    iVar10 = iVar8;
    do {
      if (pVVar4->nSize <= lVar7) {
LAB_007dbffa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar4->pArray[lVar7] != 0) {
        lVar5 = (long)pVVar4->nSize;
        if (lVar5 <= lVar7) goto LAB_007dbffa;
        lVar9 = 0;
        while( true ) {
          piVar1 = pVVar4->pArray;
          lVar6 = (long)piVar1[lVar7];
          if ((lVar6 < 0) || ((uint)lVar5 <= (uint)piVar1[lVar7])) goto LAB_007dbffa;
          if (piVar1[lVar6] <= lVar9) break;
          iVar8 = piVar1[lVar6 + lVar9 + 1];
          if (iVar10 <= lVar7) {
            uVar2 = iVar10 * 2;
            iVar10 = (int)(lVar7 + 1U);
            uVar12 = (ulong)uVar2;
            if ((int)uVar2 <= iVar10) {
              uVar12 = lVar7 + 1U & 0xffffffff;
            }
            iVar11 = (int)uVar12;
            if (iVar11 - local_4c != 0 && local_4c <= iVar11) {
              if (__ptr == (Vec_Int_t *)0x0) {
                __ptr = (Vec_Int_t *)malloc(uVar12 << 4);
              }
              else {
                __ptr = (Vec_Int_t *)realloc(__ptr,uVar12 << 4);
              }
              pVVar3->pArray = __ptr;
              memset(__ptr + local_4c,0,(long)(iVar11 - local_4c) << 4);
              pVVar3->nCap = iVar11;
              local_4c = iVar11;
            }
            pVVar3->nSize = iVar10;
          }
          Vec_IntPush(__ptr + lVar7,iVar8);
          lVar9 = lVar9 + 1;
          pVVar4 = p->vMapping;
          lVar5 = (long)pVVar4->nSize;
          if (lVar5 <= lVar7) goto LAB_007dbffa;
        }
        iVar8 = p->nObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar8);
  }
  return pVVar3;
}

Assistant:

Vec_Wec_t * Spl_ManToWecMapping( Gia_Man_t * p )
{
    Vec_Wec_t * vMapping = Vec_WecStart( Gia_ManObjNum(p) );
    int Obj, Fanin, k;
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, Obj )
        Gia_LutForEachFanin( p, Obj, Fanin, k )
            Vec_WecPush( vMapping, Obj, Fanin );
    return vMapping;
}